

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFMT.cpp
# Opt level: O3

void __thiscall FRandom::PeriodCertification(FRandom *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = (this->sfmt).u[3] & 0x5986f054 ^ (this->sfmt).u[0] & 1;
  uVar3 = 0x10;
  do {
    uVar2 = (int)uVar2 >> (sbyte)uVar3 ^ uVar2;
    bVar1 = 1 < uVar3;
    uVar3 = uVar3 >> 1;
  } while (bVar1);
  if ((uVar2 & 1) == 0) {
    *(byte *)&this->sfmt = *(byte *)&this->sfmt ^ 1;
  }
  return;
}

Assistant:

void FRandom::PeriodCertification()
{
	int inner = 0;
	int i, j;
	DWORD work;

	for (i = 0; i < 4; i++)
		inner ^= sfmt.u[idxof(i)] & parity[i];
	for (i = 16; i > 0; i >>= 1)
		inner ^= inner >> i;
	inner &= 1;
	/* check OK */
	if (inner == 1) {
		return;
	}
	/* check NG, and modification */
	for (i = 0; i < 4; i++) {
		work = 1;
		for (j = 0; j < 32; j++) {
			if ((work & parity[i]) != 0) {
				sfmt.u[idxof(i)] ^= work;
				return;
			}
			work = work << 1;
		}
	}
}